

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithScript_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithScript_Test *this)

{
  ByteData *pBVar1;
  ByteData *pBVar2;
  pointer pcVar3;
  pointer *ppuVar4;
  pointer puVar5;
  bool bVar6;
  char *message;
  long lVar7;
  pointer *ppTVar8;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  AssertionResult gtest_ar;
  SigHashType sighash_type;
  OutPoint outpoint2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign2;
  ByteData256 sighash;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  OutPoint outpoint1;
  ElementsAddressFactory factory;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  ByteData signature1;
  ByteData signature2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SignParameter sign1;
  ConfidentialTransactionContext txc;
  Address address;
  UtxoData utxo2;
  Address asset_address;
  UtxoData utxo3;
  UtxoData utxo1;
  AssertHelper local_2400;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_23f8;
  AssertHelper local_23f0;
  ByteData local_23e8;
  SigHashType local_23c4;
  OutPoint local_23b8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_2390;
  SignParameter local_2378;
  ByteData256 local_2300;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> local_22e8;
  OutPoint local_22d0;
  AddressFactory local_22a8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_2280;
  ByteData local_2268;
  ByteData local_2250;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2238;
  SigHashType local_2220;
  SigHashType local_2214;
  SigHashType local_2208;
  SigHashType local_21fc;
  SignParameter local_21f0;
  ConfidentialTransactionContext local_2178;
  undefined1 local_20c0 [32];
  undefined1 local_20a0 [16];
  pointer local_2090;
  pointer local_2078;
  pointer local_2060;
  TapBranch local_2048;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1fd0;
  Script local_1fb8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f78;
  undefined1 local_1f48 [8];
  _func_int **pp_Stack_1f40;
  undefined1 local_1f38 [16];
  undefined1 local_1f28 [32];
  Privkey local_1f08;
  pointer local_1ee8;
  TapBranch local_1ed0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1e58;
  Script local_1e40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e00 [19];
  UtxoData local_1a58;
  UtxoData local_1568;
  UtxoData local_1078;
  Address local_b88;
  UtxoData local_a10;
  UtxoData local_520;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_22a8,kElementsRegtest);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  pBVar1 = &local_1078.block_hash.data_;
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3","");
  cfd::core::Txid::Txid((Txid *)local_1f48,(string *)&local_1078);
  cfd::core::Txid::operator=(&local_520.txid,(Txid *)local_1f48);
  local_1f48 = (undefined1  [8])&PTR__Txid_00735400;
  if (pp_Stack_1f40 != (_func_int **)0x0) {
    operator_delete(pp_Stack_1f40);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_520.vout = 0;
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,
             "0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc","");
  cfd::core::Script::Script((Script *)local_1f48,(string *)&local_1078);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,
             "210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac","");
  cfd::core::Script::Script((Script *)local_1f48,(string *)&local_1078);
  cfd::core::Script::operator=(&local_520.redeem_script,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,"ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2"
             ,"");
  cfd::AddressFactory::GetAddress((Address *)local_1f48,&local_22a8,(string *)&local_1078);
  cfd::core::Address::operator=(&local_520.address,(Address *)local_1f48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1e00);
  cfd::core::Script::~Script(&local_1e40);
  local_1ed0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1e58)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1ed0);
  if (local_1ee8 != (pointer)0x0) {
    operator_delete(local_1ee8);
  }
  if ((_func_int **)
      local_1f08.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != (_func_int **)0x0) {
    operator_delete(local_1f08.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_1f28._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f28._16_8_);
  }
  if ((Privkey *)local_1f38._0_8_ != (Privkey *)local_1f28) {
    operator_delete((void *)local_1f38._0_8_);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x5549aa);
  cfd::core::Amount::Amount((Amount *)local_1f48,10000000);
  local_520.amount.ignore_check_ = pp_Stack_1f40._0_1_;
  local_520.amount.amount_ = (int64_t)local_1f48;
  local_520.address_type = kP2wshAddress;
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1f48,(string *)&local_1078);
  cfd::core::ConfidentialAssetId::operator=(&local_520.asset,(ConfidentialAssetId *)local_1f48);
  local_1f48 = (undefined1  [8])&PTR__ConfidentialAssetId_00735710;
  if (pp_Stack_1f40 != (_func_int **)0x0) {
    operator_delete(pp_Stack_1f40);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,
             "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1f48,(string *)&local_1078);
  pBVar2 = &local_a10.block_hash.data_;
  local_a10.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_1f38 + 8),(string *)&local_a10);
  pcVar3 = local_20c0 + 0x10;
  local_20c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_1f28 + 0x10),(string *)local_20c0);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1f48;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_2390,__l,(allocator_type *)&local_b88);
  lVar7 = 0x30;
  do {
    if (*(void **)(local_1f48 + lVar7) != (void *)0x0) {
      operator_delete(*(void **)(local_1f48 + lVar7));
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if ((pointer)local_20c0._0_8_ != pcVar3) {
    operator_delete((void *)local_20c0._0_8_);
  }
  if ((ByteData *)local_a10.block_height != pBVar2) {
    operator_delete((void *)local_a10.block_height);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  local_1078.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1078,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
  cfd::core::Privkey::FromWif((Privkey *)local_1f48,(string *)&local_1078,kTestnet,true);
  local_a10.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt","");
  cfd::core::Privkey::FromWif((Privkey *)local_1f28,(string *)&local_a10,kTestnet,true);
  local_20c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9","");
  cfd::core::Privkey::FromWif(&local_1f08,(string *)local_20c0,kTestnet,true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1f48;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            (&local_22e8,__l_00,(allocator_type *)&local_b88);
  lVar7 = 0x60;
  do {
    if (*(void **)(local_1f48 + lVar7 + -0x20) != (void *)0x0) {
      operator_delete(*(void **)(local_1f48 + lVar7 + -0x20));
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != 0);
  if ((pointer)local_20c0._0_8_ != pcVar3) {
    operator_delete((void *)local_20c0._0_8_);
  }
  if ((ByteData *)local_a10.block_height != pBVar2) {
    operator_delete((void *)local_a10.block_height);
  }
  if ((ByteData *)local_1078.block_height != pBVar1) {
    operator_delete((void *)local_1078.block_height);
  }
  cfd::UtxoData::UtxoData(&local_1078);
  local_1078.block_height = 0;
  local_1078.binary_data = (void *)0x0;
  local_a10.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1f48,(string *)&local_a10);
  cfd::core::Txid::operator=(&local_1078.txid,(Txid *)local_1f48);
  local_1f48 = (undefined1  [8])&PTR__Txid_00735400;
  if (pp_Stack_1f40 != (_func_int **)0x0) {
    operator_delete(pp_Stack_1f40);
  }
  if ((ByteData *)local_a10.block_height != pBVar2) {
    operator_delete((void *)local_a10.block_height);
  }
  local_1078.vout = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript((Script *)local_1f48,2,&local_2390,true);
  cfd::core::Script::operator=(&local_1078.redeem_script,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  cfd::AddressFactory::CreateP2shAddress
            ((Address *)local_1f48,&local_22a8,&local_1078.redeem_script);
  cfd::core::Address::operator=(&local_1078.address,(Address *)local_1f48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1e00);
  cfd::core::Script::~Script(&local_1e40);
  local_1ed0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1e58)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1ed0);
  if (local_1ee8 != (pointer)0x0) {
    operator_delete(local_1ee8);
  }
  if ((_func_int **)
      local_1f08.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != (_func_int **)0x0) {
    operator_delete(local_1f08.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_1f28._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1f28._16_8_);
  }
  if ((Privkey *)local_1f38._0_8_ != (Privkey *)local_1f28) {
    operator_delete((void *)local_1f38._0_8_);
  }
  cfd::core::Address::GetLockingScript((Script *)local_1f48,&local_1078.address);
  cfd::core::Script::operator=(&local_1078.locking_script,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  std::__cxx11::string::_M_replace
            ((ulong)&local_1078.descriptor,0,(char *)local_1078.descriptor._M_string_length,0x554ae6
            );
  cfd::core::Amount::Amount((Amount *)local_1f48,180000);
  local_1078.amount.ignore_check_ = pp_Stack_1f40._0_1_;
  local_1078.amount.amount_ = (int64_t)local_1f48;
  local_1078.address_type = kP2shP2wshAddress;
  local_a10.block_height = (uint64_t)pBVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1f48,(string *)&local_a10);
  cfd::core::ConfidentialAssetId::operator=(&local_1078.asset,(ConfidentialAssetId *)local_1f48);
  local_1f48 = (undefined1  [8])&PTR__ConfidentialAssetId_00735710;
  if (pp_Stack_1f40 != (_func_int **)0x0) {
    operator_delete(pp_Stack_1f40);
  }
  if ((ByteData *)local_a10.block_height != pBVar2) {
    operator_delete((void *)local_a10.block_height);
  }
  cfd::UtxoData::UtxoData(&local_a10);
  local_a10.block_height = 0;
  local_a10.binary_data = (void *)0x0;
  local_20c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1f48,(string *)local_20c0);
  cfd::core::Txid::operator=(&local_a10.txid,(Txid *)local_1f48);
  local_1f48 = (undefined1  [8])&PTR__Txid_00735400;
  if (pp_Stack_1f40 != (_func_int **)0x0) {
    operator_delete(pp_Stack_1f40);
  }
  if ((pointer)local_20c0._0_8_ != pcVar3) {
    operator_delete((void *)local_20c0._0_8_);
  }
  local_a10.vout = 2;
  local_20c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20c0,"51","");
  cfd::core::Script::Script((Script *)local_1f48,(string *)local_20c0);
  cfd::core::Script::operator=(&local_a10.locking_script,(Script *)local_1f48);
  cfd::core::Script::~Script((Script *)local_1f48);
  if ((pointer)local_20c0._0_8_ != pcVar3) {
    operator_delete((void *)local_20c0._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_a10.descriptor,0,(char *)local_a10.descriptor._M_string_length,0x554bc1);
  cfd::core::Amount::Amount((Amount *)local_1f48,10000);
  local_a10.amount.ignore_check_ = pp_Stack_1f40._0_1_;
  local_a10.amount.amount_ = (int64_t)local_1f48;
  local_a10.address_type = kP2shAddress;
  local_20c0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1f48,(string *)local_20c0);
  cfd::core::ConfidentialAssetId::operator=(&local_a10.asset,(ConfidentialAssetId *)local_1f48);
  local_1f48 = (undefined1  [8])&PTR__ConfidentialAssetId_00735710;
  if (pp_Stack_1f40 != (_func_int **)0x0) {
    operator_delete(pp_Stack_1f40);
  }
  if ((pointer)local_20c0._0_8_ != pcVar3) {
    operator_delete((void *)local_20c0._0_8_);
  }
  local_1f48 = (undefined1  [8])local_1f38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f48,"2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6","");
  cfd::AddressFactory::GetAddress((Address *)local_20c0,&local_22a8,(string *)local_1f48);
  if (local_1f48 != (undefined1  [8])local_1f38) {
    operator_delete((void *)local_1f48);
  }
  local_1f48 = (undefined1  [8])local_1f38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f48,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z","");
  cfd::AddressFactory::GetAddress(&local_b88,&local_22a8,(string *)local_1f48);
  if (local_1f48 != (undefined1  [8])local_1f38) {
    operator_delete((void *)local_1f48);
  }
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_2178,2,0);
  cfd::UtxoData::UtxoData((UtxoData *)local_1f48,&local_520);
  cfd::UtxoData::UtxoData(&local_1a58,&local_1078);
  cfd::UtxoData::UtxoData(&local_1568,&local_a10);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1f48;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2238,__l_01,(allocator_type *)&local_2378);
  lVar7 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1f48 + lVar7));
    lVar7 = lVar7 + -0x4f0;
  } while (lVar7 != -0x4f0);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::ConfidentialTransactionContext::AddInputs(&local_2178,&local_2238);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x36f,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_2178,(Address *)local_20c0,&local_520.amount,&local_520.asset);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&local_2178,&local_b88,&local_1078.amount,&local_1078.asset);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&local_2178.super_ConfidentialTransaction,&local_a10.amount,&local_a10.asset);
  cfd::core::ByteData::ByteData(&local_23e8);
  cfd::core::OutPoint::OutPoint(&local_22d0,&local_520.txid,local_520.vout);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    local_1f48 = (undefined1  [8])local_1f38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f48,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_23b8,(string *)local_1f48);
    ppuVar4 = (pointer *)
              ((long)&local_21f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 0x10);
    local_21f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)ppuVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_21f0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
    cfd::core::Privkey::FromWif((Privkey *)&local_2378,(string *)&local_21f0,kTestnet,true);
    cfd::core::SigHashType::SigHashType(&local_21fc);
    cfd::ConfidentialTransactionContext::SignWithKey
              (&local_2178,&local_22d0,(Pubkey *)&local_23b8,(Privkey *)&local_2378,&local_21fc,true
              );
    if (local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2378.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        local_21f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != ppuVar4) {
      operator_delete(local_21f0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_23b8.txid_._vptr_Txid != (_func_int **)0x0) {
      operator_delete(local_23b8.txid_._vptr_Txid);
    }
    if (local_1f48 != (undefined1  [8])local_1f38) {
      operator_delete((void *)local_1f48);
    }
  }
  testing::Message::Message((Message *)local_1f48);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2378,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37c,
             "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
  if (local_1f48 != (undefined1  [8])0x0) {
    bVar6 = testing::internal::IsTrue(true);
    if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
      (**(code **)(*(_func_int **)local_1f48 + 8))();
    }
    local_1f48 = (undefined1  [8])0x0;
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    cfd::ConfidentialTransactionContext::Verify(&local_2178,&local_22d0);
  }
  testing::Message::Message((Message *)local_1f48);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2378,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37e,
             "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
  if (local_1f48 != (undefined1  [8])0x0) {
    bVar6 = testing::internal::IsTrue(true);
    if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
      (**(code **)(*(_func_int **)local_1f48 + 8))();
    }
    local_1f48 = (undefined1  [8])0x0;
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::ConfidentialTransactionContext::IgnoreVerify(&local_2178,&local_22d0);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x37f,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2378,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2378);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  cfd::core::OutPoint::OutPoint(&local_23b8,&local_1078.txid,local_1078.vout);
  cfd::core::SigHashType::SigHashType(&local_23c4);
  cfd::core::SigHashType::SigHashType(&local_2208,&local_23c4);
  cfd::ConfidentialTransactionContext::CreateSignatureHash
            ((ByteData *)local_1f48,&local_2178,&local_23b8,&local_1078.redeem_script,&local_2208,
             &local_1078.amount,kVersion0);
  cfd::core::ByteData256::ByteData256(&local_2300,(ByteData *)local_1f48);
  if (local_1f48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f48);
  }
  cfd::core::SignatureUtil::CalculateEcSignature
            (&local_2250,&local_2300,
             local_22e8.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,true);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&local_2268,&local_2300,
             local_22e8.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,true);
  cfd::core::SigHashType::SigHashType(&local_2214,&local_23c4);
  cfd::SignParameter::SignParameter(&local_2378,&local_2250,true,&local_2214);
  cfd::SignParameter::SetRelatedPubkey
            (&local_2378,
             local_2390.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 2);
  cfd::core::SigHashType::SigHashType(&local_2220,&local_23c4);
  cfd::SignParameter::SignParameter(&local_21f0,&local_2268,true,&local_2220);
  cfd::SignParameter::SetRelatedPubkey
            (&local_21f0,
             local_2390.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::SignParameter::SignParameter((SignParameter *)local_1f48,&local_2378);
  cfd::SignParameter::SignParameter((SignParameter *)&local_1ed0,&local_21f0);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1f48;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&local_2280,__l_02,(allocator_type *)&local_2400);
  lVar7 = -0xf0;
  ppTVar8 = &local_1ed0.branch_list_.
             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl
             .super__Vector_impl_data._M_finish;
  do {
    ppTVar8[-4] = (pointer)&PTR__ScriptOperator_00734d50;
    if ((pointer)ppTVar8 != ppTVar8[-2]) {
      operator_delete(ppTVar8[-2]);
    }
    if (ppTVar8[-9] != (pointer)0x0) {
      operator_delete(ppTVar8[-9]);
    }
    if (ppTVar8[-0xd] != (pointer)0x0) {
      operator_delete(ppTVar8[-0xd]);
    }
    ppTVar8 = ppTVar8 + -0xf;
    lVar7 = lVar7 + 0x78;
  } while (lVar7 != 0);
  cfd::ConfidentialTransactionContext::AddMultisigSign
            (&local_2178,&local_23b8,&local_2280,&local_1078.redeem_script,local_1078.address_type);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::ConfidentialTransactionContext::Verify(&local_2178,&local_23b8);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_2400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x38f,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=(&local_2400,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_2400);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1f48,&local_a10.txid,local_a10.vout);
      cfd::ConfidentialTransactionContext::Verify(&local_2178,(OutPoint *)local_1f48);
      local_1f48 = (undefined1  [8])&PTR__Txid_00735400;
      if (pp_Stack_1f40 != (_func_int **)0x0) {
        operator_delete(pp_Stack_1f40);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_2400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x392,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2400,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_2400);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::ConfidentialTransactionContext::Verify(&local_2178);
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_2400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x394,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2400,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_2400);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_1f48,&local_2178);
      puVar5 = local_23e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_23e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1f48;
      local_23e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pp_Stack_1f40;
      local_23e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_1f38._0_8_;
      local_1f48 = (undefined1  [8])0x0;
      pp_Stack_1f40 = (_func_int **)0x0;
      local_1f38._0_8_ = (Privkey *)0x0;
      if ((_func_int **)puVar5 != (_func_int **)0x0) {
        operator_delete(puVar5);
      }
      if (local_1f48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1f48);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1f48);
    testing::internal::AssertHelper::AssertHelper
              (&local_2400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x396,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2400,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_2400);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1f48,&local_23e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2400,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000\""
             ,(char *)local_1f48,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000"
            );
  if (local_1f48 != (undefined1  [8])local_1f38) {
    operator_delete((void *)local_1f48);
  }
  if (local_2400.data_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1f48);
    if (local_23f8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_23f8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_23f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x397,message);
    testing::internal::AssertHelper::operator=(&local_23f0,(Message *)local_1f48);
    testing::internal::AssertHelper::~AssertHelper(&local_23f0);
    if (local_1f48 != (undefined1  [8])0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && (local_1f48 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1f48 + 8))();
      }
      local_1f48 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_23f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_2280);
  local_21f0.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_21f0.op_code_.text_data_._M_dataplus._M_p != &local_21f0.op_code_.text_data_.field_2)
  {
    operator_delete(local_21f0.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_21f0.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21f0.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_21f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_21f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2378.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2378.op_code_.text_data_._M_dataplus._M_p != &local_2378.op_code_.text_data_.field_2)
  {
    operator_delete(local_2378.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_2378.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2378.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2378.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2268.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2268.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2250.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2250.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2300.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2300.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_23b8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_23b8.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_23b8.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_22d0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_22d0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_22d0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((_func_int **)
      local_23e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_23e8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2238);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_2178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_b88.format_data_);
  cfd::core::Script::~Script(&local_b88.redeem_script_);
  local_b88.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_b88.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_b88.script_tree_.super_TapBranch);
  if (local_b88.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b88.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b88.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88.address_._M_dataplus._M_p != &local_b88.address_.field_2) {
    operator_delete(local_b88.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f78);
  cfd::core::Script::~Script(&local_1fb8);
  local_2048._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1fd0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2048);
  if (local_2060 != (pointer)0x0) {
    operator_delete(local_2060);
  }
  if (local_2078 != (pointer)0x0) {
    operator_delete(local_2078);
  }
  if (local_2090 != (pointer)0x0) {
    operator_delete(local_2090);
  }
  if ((undefined1 *)local_20c0._16_8_ != local_20a0) {
    operator_delete((void *)local_20c0._16_8_);
  }
  cfd::UtxoData::~UtxoData(&local_a10);
  cfd::UtxoData::~UtxoData(&local_1078);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector(&local_22e8);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_2390);
  cfd::UtxoData::~UtxoData(&local_520);
  local_22a8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_22a8.prefix_list_);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithScript)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address = factory.GetAddress("2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  Address asset_address = factory.GetAddress("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z");

  ConfidentialTransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount, utxo1.asset);
  txc.AddTxOut(asset_address, utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(utxo3.amount, utxo3.asset);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000");
}